

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aphy_impl.hpp
# Opt level: O0

StrongRef * __thiscall
aphy::ref<aphy::broadphase>::operator=(ref<aphy::broadphase> *this,StrongRef *other)

{
  aphy_icd_dispatch *paVar1;
  ref_counter<aphy::broadphase> *in_RSI;
  StrongRef *in_RDI;
  ref_counter<aphy::broadphase> *unaff_retaddr;
  Counter *newCounter;
  
  paVar1 = in_RSI->dispatchTable;
  if (paVar1 != (aphy_icd_dispatch *)0x0) {
    ref_counter<aphy::broadphase>::retain(in_RSI);
  }
  if (in_RDI->counter != (Counter *)0x0) {
    ref_counter<aphy::broadphase>::release(unaff_retaddr);
  }
  in_RDI->counter = (Counter *)paVar1;
  return in_RDI;
}

Assistant:

StrongRef &operator=(const StrongRef &other)
    {
        auto newCounter = other.counter;
        if(newCounter)
            newCounter->retain();
        if(counter)
            counter->release();
        counter = newCounter;
        return *this;
    }